

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_b7eda::fillPixels(Array2D<float> *pf,int width,int height)

{
  float *pfVar1;
  int in_EDX;
  int in_ESI;
  Array2D<float> *in_RDI;
  int x;
  int y;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      pfVar1 = Imf_3_4::Array2D<float>::operator[](in_RDI,(long)local_14);
      pfVar1[local_18] = (float)(local_18 % 10 + (local_14 % 0x11) * 10);
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<float>& pf, int width, int height)
{
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            pf[y][x] = x % 10 + 10 * (y % 17);
}